

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O2

void wabt::WriteS32Leb128(Stream *stream,uint32_t value,char *desc)

{
  long lVar1;
  uint8_t data [5];
  byte local_5 [5];
  
  lVar1 = 0;
  if ((int)value < 0) {
    while( true ) {
      if ((value & 0x40) != 0 && (int)value >> 7 == 0xffffffff) break;
      local_5[lVar1] = (byte)value | 0x80;
      lVar1 = lVar1 + 1;
      value = (int)value >> 7;
    }
    value = (uint32_t)((byte)value & 0x7f);
  }
  else {
    for (; 0x3f < value; value = value >> 7) {
      local_5[lVar1] = (byte)value | 0x80;
      lVar1 = lVar1 + 1;
    }
  }
  local_5[lVar1] = (byte)value;
  Stream::WriteData(stream,local_5,lVar1 + 1,desc,No);
  return;
}

Assistant:

void WriteS32Leb128(Stream* stream, uint32_t value, const char* desc) {
  WriteS32Leb128(stream, Bitcast<int32_t>(value), desc);
}